

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

int xmlSchemaIsDerivedFromBuiltInType(xmlSchemaTypePtr type,int valType)

{
  int iVar1;
  
  do {
    if (type == (xmlSchemaTypePtr)0x0) {
      return 0;
    }
    if (type->type == XML_SCHEMA_TYPE_COMPLEX) {
      return 0;
    }
    iVar1 = type->builtInType;
    if (iVar1 == 0x2d) {
      return 0;
    }
    if (type->type == XML_SCHEMA_TYPE_BASIC) {
      if (iVar1 == 0x17) {
        return 1;
      }
      if (iVar1 == 0x2e) {
        return 0;
      }
    }
    type = type->subtypes;
  } while( true );
}

Assistant:

static int
xmlSchemaIsDerivedFromBuiltInType(xmlSchemaTypePtr type, int valType)
{
    if (type == NULL)
	return (0);
    if (WXS_IS_COMPLEX(type))
	return (0);
    if (type->type == XML_SCHEMA_TYPE_BASIC) {
	if (type->builtInType == valType)
	    return(1);
	if ((type->builtInType == XML_SCHEMAS_ANYSIMPLETYPE) ||
	    (type->builtInType == XML_SCHEMAS_ANYTYPE))
	    return (0);
	return(xmlSchemaIsDerivedFromBuiltInType(type->subtypes, valType));
    }
    return(xmlSchemaIsDerivedFromBuiltInType(type->subtypes, valType));
}